

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParticleArrayTests.cpp
# Opt level: O3

void __thiscall
ParticleArrayTest_DefaultConstructor_Test<pica::ParticleArraySoA<pica::Particle<(pica::Dimension)1>_>_>
::TestBody(ParticleArrayTest_DefaultConstructor_Test<pica::ParticleArraySoA<pica::Particle<(pica::Dimension)1>_>_>
           *this)

{
  void *pvVar1;
  bool bVar2;
  long lVar3;
  char *message;
  AssertionResult gtest_ar;
  ParticleArray particles;
  Message local_d0;
  AssertHelper local_c8;
  internal local_c0 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_b8;
  long local_b0 [21];
  
  memset(local_b0,0,0xa8);
  local_d0.ss_.ptr_._0_4_ = 0;
  local_c8.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<int,int>
            (local_c0,"0","particles.size()",(int *)&local_d0,(int *)&local_c8);
  if (local_c0[0] == (internal)0x0) {
    testing::Message::Message(&local_d0);
    if (local_b8.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_b8.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/pictools[P]pica/test/src/particles/ParticleArrayTests.cpp"
               ,0x2b,message);
    testing::internal::AssertHelper::operator=(&local_c8,&local_d0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    if (CONCAT44(local_d0.ss_.ptr_._4_4_,local_d0.ss_.ptr_._0_4_) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((long *)CONCAT44(local_d0.ss_.ptr_._4_4_,local_d0.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_d0.ss_.ptr_._4_4_,local_d0.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_b8,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  lVar3 = 0x48;
  do {
    pvVar1 = *(void **)((long)local_b0 + lVar3);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,*(long *)((long)local_b0 + lVar3 + 0x10) - (long)pvVar1);
    }
    lVar3 = lVar3 + -0x18;
  } while (lVar3 != 0);
  return;
}

Assistant:

TYPED_TEST(ParticleArrayTest, DefaultConstructor)
{
    typedef typename ParticleArrayTest<TypeParam>::ParticleArray ParticleArray;

    ParticleArray particles;
    ASSERT_EQ(0, particles.size());
}